

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlyANSIPortDecl.cpp
# Opt level: O1

bool __thiscall OnlyANSIPortDecl::check(OnlyANSIPortDecl *this,RootSymbol *root)

{
  MainVisitor visitor;
  MainVisitor local_38;
  
  local_38.super_TidyVisitor.sourceManager = Registry::getSourceManager();
  local_38.super_TidyVisitor.diags = &(this->super_TidyCheck).diagnostics;
  local_38.super_TidyVisitor.config = Registry::config();
  slang::ast::Symbol::visit<no_ansi_port_decl::MainVisitor&>(&root->super_Symbol,&local_38);
  return (this->super_TidyCheck).diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
         super_SmallVectorBase<slang::Diagnostic>.len == 0;
}

Assistant:

bool check(const ast::RootSymbol& root) override {
        MainVisitor visitor(diagnostics);
        root.visit(visitor);
        return diagnostics.empty();
    }